

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Action<int_(int,_int)> __thiscall
testing::PolymorphicAction::operator_cast_to_Action(PolymorphicAction *this)

{
  undefined8 *puVar1;
  linked_ptr_internal extraout_RDX;
  undefined8 *in_RSI;
  Action<int_(int,_int)> AVar2;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR__ActionInterface_0017ad18;
  puVar1[1] = *in_RSI;
  *(undefined8 **)this = puVar1;
  *(PolymorphicAction **)(this + 8) = this + 8;
  AVar2.impl_.link_.next_ = extraout_RDX.next_;
  AVar2.impl_.value_ = (ActionInterface<int_(int,_int)> *)this;
  return (Action<int_(int,_int)>)AVar2.impl_;
}

Assistant:

operator Action<F>() const {
    return Action<F>(new MonomorphicImpl<F>(impl_));
  }